

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientImpl.cpp
# Opt level: O3

int __thiscall
SL::WS_LITE::WSClient_Configuration::connect
          (WSClient_Configuration *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  _Atomic_word *p_Var1;
  _Tuple_impl<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
  _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  resolver_service<asio::ip::tcp> *prVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  io_context_impl *piVar6;
  basic_resolver<asio::ip::tcp> *pbVar7;
  int iVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
  *prVar9;
  error_category *peVar10;
  undefined4 in_register_00000034;
  thread_info_base *ptVar11;
  long *in_R9;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  long in_FS_OFFSET;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *in_stack_00000008;
  shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>_> resolver;
  shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
  socket;
  __alloc_node_gen_t __alloc_node_gen;
  string portstr;
  value_type res;
  query query;
  basic_resolver<asio::ip::tcp> *local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  pointer local_1d8;
  element_type *local_1d0;
  ptr local_1c8;
  long *local_1a8 [2];
  long local_198 [2];
  undefined1 local_188 [16];
  undefined1 local_178 [32];
  _Alloc_hider local_158;
  char local_148 [24];
  _Alloc_hider local_130;
  char local_120 [16];
  undefined1 local_110 [72];
  _Alloc_hider local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined8 local_b0;
  WSClient_Configuration *local_a8;
  undefined1 local_a0 [32];
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  _Alloc_hider local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_b0 = CONCAT44(in_register_00000034,__fd);
  _Var2.super__Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false>._M_head_impl =
       ((_Tuple_impl<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
         *)(local_b0 + 8))->
       super__Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false>;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_b0 + 0x10);
  uVar12 = (ushort)__len;
  local_178._24_8_ = this_00;
  local_a8 = this;
  if ((char)(((implementation_type *)
             ((long)_Var2.super__Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false>
                    ._M_head_impl + 0x28))->super_base_implementation_type).socket_ != '\x01') {
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    HubContext::getnextContext((HubContext *)local_188);
    std::
    __shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<std::allocator<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>,std::shared_ptr<SL::WS_LITE::WebSocketContext>&,asio::io_context&>
              ((__shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>,(__gnu_cxx::_Lock_policy)2>
                *)&local_1d8,
               (allocator<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *)local_178,(shared_ptr<SL::WS_LITE::WebSocketContext> *)(local_188._0_8_ + 0x38),
               (io_context *)(local_188._0_8_ + 8));
    *(undefined1 *)
     ((long)&local_1d8[3].super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr + 7) = 0;
    uVar13 = __len & 0xffff;
    uVar14 = 1;
    if (((9 < uVar12) && (uVar14 = 2, 99 < uVar12)) && (uVar14 = 3, 999 < uVar13)) {
      uVar14 = 5 - (uVar13 < 10000);
    }
    local_1a8[0] = local_198;
    std::__cxx11::string::_M_construct((ulong)local_1a8,(char)uVar14);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1a8[0],uVar14,uVar13);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_178,(char *)local_1a8[0],(allocator<char> *)&local_1c8);
    asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
              ((basic_resolver_query<asio::ip::tcp> *)local_a0,(string *)__addr,(string *)local_178,
               address_configured);
    if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
    }
    local_1e8 = (basic_resolver<asio::ip::tcp> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<asio::ip::basic_resolver<asio::ip::tcp>,std::allocator<asio::ip::basic_resolver<asio::ip::tcp>>,asio::io_context&>
              (&local_1e0,&local_1e8,
               (allocator<asio::ip::basic_resolver<asio::ip::tcp>_> *)local_178,
               (io_context *)
               ((local_1d8[5].
                 super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->work).io_context_impl_);
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    pbVar7 = local_1e8;
    this_01->_M_use_count = 1;
    this_01->_M_weak_count = 1;
    this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00180b60;
    *(undefined1 *)&this_01[1]._vptr__Sp_counted_base = 0;
    local_178._0_8_ = local_1d8;
    local_178._8_8_ = local_1d0;
    if (local_1d0 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(local_1d0->ThreadContexts).
                 super__Vector_base<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
                 ._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(local_1d0->ThreadContexts).
                      super__Vector_base<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
        UNLOCK();
      }
      else {
        *(int *)&(local_1d0->ThreadContexts).
                 super__Vector_base<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
                 ._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(local_1d0->ThreadContexts).
                      super__Vector_base<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_158._M_p = local_148;
    local_178._16_8_ = _Var2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,*(long *)__addr,*(long *)(__addr->sa_data + 6) + *(long *)__addr
              );
    local_130._M_p = local_120;
    std::__cxx11::string::_M_construct<char*>((string *)&local_130,*in_R9,in_R9[1] + *in_R9);
    local_1c8.h = (type_conflict *)local_110;
    local_110._0_8_ = (element_type *)0x0;
    local_110._8_8_ = in_stack_00000008->_M_bucket_count;
    local_110._16_8_ = (element_type *)0x0;
    local_110._24_8_ = in_stack_00000008->_M_element_count;
    local_110._32_8_ = *(undefined8 *)&in_stack_00000008->_M_rehash_policy;
    local_110._40_8_ = (in_stack_00000008->_M_rehash_policy)._M_next_resize;
    local_110._48_8_ = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)local_1c8.h,in_stack_00000008,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                *)&local_1c8);
    local_c8._M_p = (pointer)(this_01 + 1);
    local_110._56_8_ = local_1e8;
    local_110._64_8_ = local_1e0._M_pi;
    if (local_1e0._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0013c5df:
      if (__libc_single_threaded != '\0') goto LAB_0013c5f7;
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1e0._M_pi)->_M_use_count = (local_1e0._M_pi)->_M_use_count + 1;
        UNLOCK();
        goto LAB_0013c5df;
      }
      (local_1e0._M_pi)->_M_use_count = (local_1e0._M_pi)->_M_use_count + 1;
LAB_0013c5f7:
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
    prVar3 = (pbVar7->super_basic_io_object<asio::detail::resolver_service<asio::ip::tcp>,_true>).
             service_;
    if (*(long *)(in_FS_OFFSET + -8) == 0) {
      ptVar11 = (thread_info_base *)0x0;
    }
    else {
      ptVar11 = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -8) + 8);
    }
    local_1c8.h = (type_conflict *)local_178;
    local_c0._M_pi = this_01;
    prVar9 = (resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
              *)asio::detail::thread_info_base::allocate(ptVar11,0x178);
    local_1c8.p = (resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
                   *)0x0;
    peVar4 = (pbVar7->super_basic_io_object<asio::detail::resolver_service<asio::ip::tcp>,_true>).
             implementation_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var5 = (pbVar7->super_basic_io_object<asio::detail::resolver_service<asio::ip::tcp>,_true>).
             implementation_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
      }
    }
    piVar6 = (prVar3->super_resolver_service_base).io_context_impl_;
    (prVar9->super_resolve_op).super_operation.next_ = (scheduler_operation *)0x0;
    (prVar9->super_resolve_op).super_operation.func_ =
         asio::detail::
         resolve_query_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ClientImpl.cpp:141:40)>
         ::do_complete;
    (prVar9->super_resolve_op).super_operation.task_result_ = 0;
    (prVar9->super_resolve_op).ec_._M_value = 0;
    local_1c8.v = prVar9;
    peVar10 = (error_category *)std::_V2::system_category();
    (prVar9->super_resolve_op).ec_._M_cat = peVar10;
    (prVar9->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    (prVar9->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var5;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
      }
    }
    *(undefined4 *)&(prVar9->query_).hints_.ai_canonname = local_80;
    *(undefined4 *)((long)&(prVar9->query_).hints_.ai_canonname + 4) = uStack_7c;
    *(undefined4 *)&(prVar9->query_).hints_.ai_next = uStack_78;
    *(undefined4 *)((long)&(prVar9->query_).hints_.ai_next + 4) = uStack_74;
    (prVar9->query_).hints_.ai_addrlen = local_a0._16_4_;
    *(undefined4 *)&(prVar9->query_).hints_.field_0x14 = local_a0._20_4_;
    *(undefined4 *)&(prVar9->query_).hints_.ai_addr = local_a0._24_4_;
    *(undefined4 *)((long)&(prVar9->query_).hints_.ai_addr + 4) = local_a0._28_4_;
    (prVar9->query_).hints_.ai_flags = local_a0._0_4_;
    (prVar9->query_).hints_.ai_family = local_a0._4_4_;
    (prVar9->query_).hints_.ai_socktype = local_a0._8_4_;
    (prVar9->query_).hints_.ai_protocol = local_a0._12_4_;
    (prVar9->query_).host_name_._M_dataplus._M_p = (pointer)&(prVar9->query_).host_name_.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(prVar9->query_).host_name_,local_70._M_p,
               local_70._M_p + (long)local_68._M_pi);
    (prVar9->query_).service_name_._M_dataplus._M_p =
         (pointer)&(prVar9->query_).service_name_.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(prVar9->query_).service_name_,local_50._M_p,local_50._M_p + local_48);
    prVar9->io_context_impl_ = piVar6;
    Connect<SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::$_1&>(std::shared_ptr<SL::WS_LITE::HubContext>,std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::$_1&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
    ::{lambda(std::error_code_const&,asio::ip::basic_resolver_iterator<asio::ip::tcp>)#1}::
    tcp>__1____((_lambda_std__error_code_const__asio__ip__basic_resolver_iterator<asio::ip::tcp>__1_
                 *)&prVar9->handler_,(type_conflict *)local_178);
    prVar9->addrinfo_ = (addrinfo_type *)0x0;
    local_1c8.p = prVar9;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var5->_M_weak_count;
        iVar8 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar8 = p_Var5->_M_weak_count;
        p_Var5->_M_weak_count = iVar8 + -1;
      }
      if (iVar8 == 1) {
        (*p_Var5->_vptr__Sp_counted_base[3])(p_Var5);
      }
    }
    asio::detail::resolver_service_base::start_resolve_op
              (&prVar3->super_resolver_service_base,&(local_1c8.p)->super_resolve_op);
    local_1c8.v = (resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
                   *)0x0;
    local_1c8.p = (resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
                   *)0x0;
    asio::detail::
    resolve_query_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ClientImpl.cpp:141:40)>
    ::ptr::reset(&local_1c8);
    Connect<SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::$_1&>(std::shared_ptr<SL::WS_LITE::HubContext>,std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::$_1&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
    ::{lambda(std::error_code_const&,asio::ip::basic_resolver_iterator<asio::ip::tcp>)#1}::
    ~basic_resolver_iterator
              ((_lambda_std__error_code_const__asio__ip__basic_resolver_iterator<asio::ip::tcp>__1_
                *)local_178);
    goto LAB_0013c987;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  HubContext::getnextContext((HubContext *)local_188);
  std::
  __shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::allocator<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>,std::shared_ptr<SL::WS_LITE::WebSocketContext>&,asio::io_context&,asio::ssl::context&>
            ((__shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>,(__gnu_cxx::_Lock_policy)2>
              *)&local_1d8,
             (allocator<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
              *)local_178,(shared_ptr<SL::WS_LITE::WebSocketContext> *)(local_188._0_8_ + 0x38),
             (io_context *)(local_188._0_8_ + 8),(context *)(local_188._0_8_ + 0x20));
  *(undefined1 *)
   ((long)&local_1d8[3].super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr + 7) = 0;
  uVar13 = __len & 0xffff;
  uVar14 = 1;
  if (((9 < uVar12) && (uVar14 = 2, 99 < uVar12)) && (uVar14 = 3, 999 < uVar13)) {
    uVar14 = 5 - (uVar13 < 10000);
  }
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct((ulong)local_1a8,(char)uVar14);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1a8[0],uVar14,uVar13);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_178,(char *)local_1a8[0],(allocator<char> *)&local_1c8);
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<asio::ip::tcp> *)local_a0,(string *)__addr,(string *)local_178,
             address_configured);
  if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  local_1e8 = (basic_resolver<asio::ip::tcp> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<asio::ip::basic_resolver<asio::ip::tcp>,std::allocator<asio::ip::basic_resolver<asio::ip::tcp>>,asio::io_context&>
            (&local_1e0,&local_1e8,(allocator<asio::ip::basic_resolver<asio::ip::tcp>_> *)local_178,
             (io_context *)
             ((local_1d8[5].
               super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             work).io_context_impl_);
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  pbVar7 = local_1e8;
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00180b60;
  *(undefined1 *)&this_01[1]._vptr__Sp_counted_base = 0;
  local_178._0_8_ = local_1d8;
  local_178._8_8_ = local_1d0;
  if (local_1d0 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_1d0->ThreadContexts).
               super__Vector_base<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(local_1d0->ThreadContexts).
                    super__Vector_base<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_1d0->ThreadContexts).
               super__Vector_base<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(local_1d0->ThreadContexts).
                    super__Vector_base<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_158._M_p = local_148;
  local_178._16_8_ = _Var2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,*(long *)__addr,*(long *)(__addr->sa_data + 6) + *(long *)__addr);
  local_130._M_p = local_120;
  std::__cxx11::string::_M_construct<char*>((string *)&local_130,*in_R9,in_R9[1] + *in_R9);
  local_1c8.h = (type_conflict *)local_110;
  local_110._0_8_ = (element_type *)0x0;
  local_110._8_8_ = in_stack_00000008->_M_bucket_count;
  local_110._16_8_ = (element_type *)0x0;
  local_110._24_8_ = in_stack_00000008->_M_element_count;
  local_110._32_8_ = *(undefined8 *)&in_stack_00000008->_M_rehash_policy;
  local_110._40_8_ = (in_stack_00000008->_M_rehash_policy)._M_next_resize;
  local_110._48_8_ = 0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_1c8.h,in_stack_00000008,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
              *)&local_1c8);
  local_c8._M_p = (pointer)(this_01 + 1);
  local_110._56_8_ = local_1e8;
  local_110._64_8_ = local_1e0._M_pi;
  if (local_1e0._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0013c5b8:
    if (__libc_single_threaded != '\0') goto LAB_0013c5cc;
    LOCK();
    this_01->_M_use_count = this_01->_M_use_count + 1;
    UNLOCK();
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1e0._M_pi)->_M_use_count = (local_1e0._M_pi)->_M_use_count + 1;
      UNLOCK();
      goto LAB_0013c5b8;
    }
    (local_1e0._M_pi)->_M_use_count = (local_1e0._M_pi)->_M_use_count + 1;
LAB_0013c5cc:
    this_01->_M_use_count = this_01->_M_use_count + 1;
  }
  prVar3 = (pbVar7->super_basic_io_object<asio::detail::resolver_service<asio::ip::tcp>,_true>).
           service_;
  if (*(long *)(in_FS_OFFSET + -8) == 0) {
    ptVar11 = (thread_info_base *)0x0;
  }
  else {
    ptVar11 = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -8) + 8);
  }
  local_1c8.h = (type_conflict *)local_178;
  local_c0._M_pi = this_01;
  prVar9 = (resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
            *)asio::detail::thread_info_base::allocate(ptVar11,0x178);
  local_1c8.p = (resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
                 *)0x0;
  peVar4 = (pbVar7->super_basic_io_object<asio::detail::resolver_service<asio::ip::tcp>,_true>).
           implementation_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (pbVar7->super_basic_io_object<asio::detail::resolver_service<asio::ip::tcp>,_true>).
           implementation_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
    }
  }
  piVar6 = (prVar3->super_resolver_service_base).io_context_impl_;
  (prVar9->super_resolve_op).super_operation.next_ = (scheduler_operation *)0x0;
  (prVar9->super_resolve_op).super_operation.func_ =
       asio::detail::
       resolve_query_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ClientImpl.cpp:141:40)>
       ::do_complete;
  (prVar9->super_resolve_op).super_operation.task_result_ = 0;
  (prVar9->super_resolve_op).ec_._M_value = 0;
  local_1c8.v = prVar9;
  peVar10 = (error_category *)std::_V2::system_category();
  (prVar9->super_resolve_op).ec_._M_cat = peVar10;
  (prVar9->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (prVar9->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var5;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
    }
  }
  *(undefined4 *)&(prVar9->query_).hints_.ai_canonname = local_80;
  *(undefined4 *)((long)&(prVar9->query_).hints_.ai_canonname + 4) = uStack_7c;
  *(undefined4 *)&(prVar9->query_).hints_.ai_next = uStack_78;
  *(undefined4 *)((long)&(prVar9->query_).hints_.ai_next + 4) = uStack_74;
  (prVar9->query_).hints_.ai_addrlen = local_a0._16_4_;
  *(undefined4 *)&(prVar9->query_).hints_.field_0x14 = local_a0._20_4_;
  *(undefined4 *)&(prVar9->query_).hints_.ai_addr = local_a0._24_4_;
  *(undefined4 *)((long)&(prVar9->query_).hints_.ai_addr + 4) = local_a0._28_4_;
  (prVar9->query_).hints_.ai_flags = local_a0._0_4_;
  (prVar9->query_).hints_.ai_family = local_a0._4_4_;
  (prVar9->query_).hints_.ai_socktype = local_a0._8_4_;
  (prVar9->query_).hints_.ai_protocol = local_a0._12_4_;
  (prVar9->query_).host_name_._M_dataplus._M_p = (pointer)&(prVar9->query_).host_name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(prVar9->query_).host_name_,local_70._M_p,
             local_70._M_p + (long)local_68._M_pi);
  (prVar9->query_).service_name_._M_dataplus._M_p = (pointer)&(prVar9->query_).service_name_.field_2
  ;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(prVar9->query_).service_name_,local_50._M_p,local_50._M_p + local_48);
  prVar9->io_context_impl_ = piVar6;
  Connect<SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::$_0&>(std::shared_ptr<SL::WS_LITE::HubContext>,std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::$_0&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
  ::{lambda(std::error_code_const&,asio::ip::basic_resolver_iterator<asio::ip::tcp>)#1}::tcp>__1____
            ((_lambda_std__error_code_const__asio__ip__basic_resolver_iterator<asio::ip::tcp>__1_ *)
             &prVar9->handler_,(type *)local_178);
  prVar9->addrinfo_ = (addrinfo_type *)0x0;
  local_1c8.p = prVar9;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var5->_M_weak_count;
      iVar8 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar8 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar8 + -1;
    }
    if (iVar8 == 1) {
      (*p_Var5->_vptr__Sp_counted_base[3])(p_Var5);
    }
  }
  asio::detail::resolver_service_base::start_resolve_op
            (&prVar3->super_resolver_service_base,&(local_1c8.p)->super_resolve_op);
  local_1c8.v = (resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
                 *)0x0;
  local_1c8.p = (resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
                 *)0x0;
  asio::detail::
  resolve_query_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ClientImpl.cpp:141:40)>
  ::ptr::reset(&local_1c8);
  Connect<SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::$_0&>(std::shared_ptr<SL::WS_LITE::HubContext>,std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::$_0&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
  ::{lambda(std::error_code_const&,asio::ip::basic_resolver_iterator<asio::ip::tcp>)#1}::
  ~basic_resolver_iterator
            ((_lambda_std__error_code_const__asio__ip__basic_resolver_iterator<asio::ip::tcp>__1_ *)
             local_178);
LAB_0013c987:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
  }
  if (local_50._M_p != local_a0 + 0x60) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  if (local_70._M_p != local_a0 + 0x40) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0],local_198[0] + 1);
  }
  if (local_1d0 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  local_178._0_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SL::WS_LITE::WSClient,std::allocator<SL::WS_LITE::WSClient>,std::shared_ptr<SL::WS_LITE::HubContext>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_178 + 8),(WSClient **)local_178,
             (allocator<SL::WS_LITE::WSClient> *)local_a0,
             (shared_ptr<SL::WS_LITE::HubContext> *)(local_b0 + 8));
  (local_a8->super_IWSClient_Configuration)._vptr_IWSClient_Configuration =
       (_func_int **)local_178._0_8_;
  (local_a8->Impl_).super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_178._8_8_;
  return (int)local_a8;
}

Assistant:

std::shared_ptr<IWSHub> WSClient_Configuration::connect(const std::string &host, PortNumber port, bool no_delay, const std::string &endpoint,
                                                            const std::unordered_map<std::string, std::string> &extraheaders)
    {
        if (Impl_->TLSEnabled) {
            auto createsocket = [](const std::shared_ptr<ThreadContext> &res) {
                return std::make_shared<WebSocket<false, asio::ssl::stream<asio::ip::tcp::socket>>>(res->WebSocketContext_, res->io_service,
                                                                                                    res->context);
            };
            Connect(Impl_, host, port, no_delay, createsocket, endpoint, extraheaders);
        }
        else {
            auto createsocket = [](const std::shared_ptr<ThreadContext> &res) {
                return std::make_shared<WebSocket<false, asio::ip::tcp::socket>>(res->WebSocketContext_, res->io_service);
            };
            Connect(Impl_, host, port, no_delay, createsocket, endpoint, extraheaders);
        }
        return std::make_shared<WSClient>(Impl_);
    }